

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_fetch_next(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_col *pCol_00;
  jx9_value *pValue_00;
  jx9_value *pValue;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name");
    jx9_result_null(pCtx);
  }
  else {
    _rc = jx9_value_to_string(*argv,(int *)((long)&pValue + 4));
    if (pValue._4_4_ < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_null(pCtx);
    }
    else {
      sName.zString._0_4_ = pValue._4_4_;
      sName._8_8_ = jx9_context_user_data(pCtx);
      pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&rc,4);
      if (pCol_00 == (unqlite_col *)0x0) {
        jx9_result_null(pCtx);
      }
      else {
        pValue_00 = jx9_context_new_scalar(pCtx);
        if (pValue_00 == (jx9_value *)0x0) {
          jx9_context_throw_error(pCtx,1,"Jx9 is running out of memory");
          jx9_result_null(pCtx);
        }
        else {
          pValue._0_4_ = unqliteCollectionFetchNextRecord(pCol_00,pValue_00);
          if ((int)pValue == 0) {
            jx9_result_value(pCtx,pValue_00);
          }
          else {
            jx9_result_null(pCtx);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_next(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Fetch the current record */
		jx9_value *pValue;
		pValue = jx9_context_new_scalar(pCtx);
		if( pValue == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}else{
			rc = unqliteCollectionFetchNextRecord(pCol,pValue);
			if( rc == UNQLITE_OK ){
				jx9_result_value(pCtx,pValue);
				/* pValue will be automatically released as soon we return from this function */
			}else{
				/* Return null */
				jx9_result_null(pCtx);
			}
		}
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}